

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

bool __thiscall Catch::clara::TextFlow::Column::iterator::isBoundary(iterator *this,size_t at)

{
  pointer pbVar1;
  bool bVar2;
  
  pbVar1 = (this->m_column->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(size_type *)((long)(pbVar1 + this->m_stringIndex) + 8) != at) {
    bVar2 = isWhitespace(*(char *)(*(long *)&pbVar1[this->m_stringIndex]._M_dataplus + at));
    if ((bVar2) &&
       (bVar2 = isWhitespace(*(char *)(*(long *)&(this->m_column->m_strings).
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start
                                                 [this->m_stringIndex]._M_dataplus + -1 + at)),
       !bVar2)) {
      return true;
    }
    bVar2 = isBreakableBefore(*(char *)(*(long *)&(this->m_column->m_strings).
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [this->m_stringIndex]._M_dataplus + at));
    if (!bVar2) {
      bVar2 = isBreakableAfter(*(char *)(*(long *)&(this->m_column->m_strings).
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [this->m_stringIndex]._M_dataplus + -1 + at));
      return bVar2;
    }
  }
  return true;
}

Assistant:

auto isBoundary(size_t at) const -> bool {
			assert(at > 0);
			assert(at <= line().size());

			return at == line().size() ||
				(isWhitespace(line()[at]) && !isWhitespace(line()[at - 1])) ||
				isBreakableBefore(line()[at]) ||
				isBreakableAfter(line()[at - 1]);
		}